

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_decimal<unsigned_long_long>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          unsigned_long_long value)

{
  basic_buffer<char> *pbVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  ptrdiff_t _Num;
  byte bVar6;
  undefined1 *puVar7;
  uint uVar8;
  ulong __n;
  ulong uVar9;
  undefined1 auStack_48 [32];
  
  lVar5 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  uVar8 = ((uint)lVar5 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar8 = (uVar8 - (value < *(ulong *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64 +
                                      (ulong)uVar8 * 8))) + 1;
  __n = (ulong)uVar8;
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar9 = sVar2 + __n;
  if (pbVar1->capacity_ < uVar9) {
    (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar9);
  }
  pbVar1->size_ = uVar9;
  puVar7 = auStack_48 + __n;
  uVar9 = value;
  if (99 < value) {
    do {
      value = uVar9 / 100;
      *(undefined2 *)(puVar7 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar9 + (int)value * -100) * 2)
      ;
      puVar7 = puVar7 + -2;
      bVar4 = 9999 < uVar9;
      uVar9 = value;
    } while (bVar4);
  }
  pcVar3 = pbVar1->ptr_;
  if (value < 10) {
    bVar6 = (byte)value | 0x30;
    lVar5 = -1;
  }
  else {
    puVar7[-1] = internal::basic_data<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
    bVar6 = internal::basic_data<void>::DIGITS[value * 2 & 0x1fffffffe];
    lVar5 = -2;
  }
  puVar7[lVar5] = bVar6;
  if (uVar8 != 0) {
    memcpy(pcVar3 + sVar2,auStack_48,__n);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }